

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O0

int Fl::scheme(char *s)

{
  int iVar1;
  Fl_Window *pFVar2;
  char *local_18;
  char *key;
  char *s_local;
  
  key = s;
  if ((s == (char *)0x0) && (key = getenv("FLTK_SCHEME"), key == (char *)0x0)) {
    local_18 = (char *)0x0;
    pFVar2 = first_window();
    if (pFVar2 != (Fl_Window *)0x0) {
      pFVar2 = first_window();
      local_18 = Fl_Window::xclass(pFVar2);
    }
    if (local_18 == (char *)0x0) {
      local_18 = "fltk";
    }
    fl_open_display();
    key = (char *)XGetDefault(fl_display,local_18,"scheme");
  }
  if (key != (char *)0x0) {
    iVar1 = fl_ascii_strcasecmp(key,"none");
    if (((iVar1 == 0) || (iVar1 = fl_ascii_strcasecmp(key,"base"), iVar1 == 0)) || (*key == '\0')) {
      key = (char *)0x0;
    }
    else {
      iVar1 = fl_ascii_strcasecmp(key,"gtk+");
      if (iVar1 == 0) {
        key = strdup("gtk+");
      }
      else {
        iVar1 = fl_ascii_strcasecmp(key,"plastic");
        if (iVar1 == 0) {
          key = strdup("plastic");
        }
        else {
          iVar1 = fl_ascii_strcasecmp(key,"gleam");
          if (iVar1 == 0) {
            key = strdup("gleam");
          }
          else {
            key = (char *)0x0;
          }
        }
      }
    }
  }
  if (scheme_ != (char *)0x0) {
    free(scheme_);
  }
  scheme_ = key;
  strcpy(scheme::e,"FLTK_SCHEME=");
  if (key != (char *)0x0) {
    fl_strlcat(scheme::e,key,0x400);
  }
  putenv(scheme::e);
  iVar1 = reload_scheme();
  return iVar1;
}

Assistant:

int Fl::scheme(const char *s) {
  if (!s) {
    if ((s = getenv("FLTK_SCHEME")) == NULL) {
#if !defined(WIN32) && !defined(__APPLE__)
      const char* key = 0;
      if (Fl::first_window()) key = Fl::first_window()->xclass();
      if (!key) key = "fltk";
      fl_open_display();
      s = XGetDefault(fl_display, key, "scheme");
#endif // !WIN32 && !__APPLE__
    }
  }

  if (s) {
    if (!fl_ascii_strcasecmp(s, "none") || !fl_ascii_strcasecmp(s, "base") || !*s) s = 0;
    else if (!fl_ascii_strcasecmp(s, "gtk+")) s = strdup("gtk+");
    else if (!fl_ascii_strcasecmp(s, "plastic")) s = strdup("plastic");
    else if (!fl_ascii_strcasecmp(s, "gleam")) s = strdup("gleam");
    else s = 0;
  }
  if (scheme_) free((void*)scheme_);
  scheme_ = s;

  // Save the new scheme in the FLTK_SCHEME env var so that child processes
  // inherit it...
  static char e[1024];
  strcpy(e,"FLTK_SCHEME=");
  if (s) strlcat(e,s,sizeof(e));
  putenv(e);

  // Load the scheme...
  return reload_scheme();
}